

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

ly_set * lyd_find_instance(lyd_node *data,lys_node *schema)

{
  lyd_node **pplVar1;
  uint uVar2;
  lyd_node *plVar3;
  ly_set *set;
  ly_set *set_00;
  LY_ERR *pLVar4;
  uint uVar5;
  lyd_node *node;
  lys_module *node_00;
  long lVar6;
  ulong uVar7;
  ly_set *local_38;
  
  if ((schema == (lys_node *)0x0 || data == (lyd_node *)0x0) ||
     ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
    return (ly_set *)0x0;
  }
  local_38 = (ly_set *)calloc(1,0x10);
  set = (ly_set *)calloc(1,0x10);
  if (set != (ly_set *)0x0 && local_38 != (ly_set *)0x0) {
    do {
      pplVar1 = &data->parent;
      plVar3 = data;
      data = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      node = plVar3;
      plVar3 = node->prev;
    } while (node->prev->next != (lyd_node *)0x0);
    do {
      lVar6 = 0x58;
      if ((schema->nodetype != LYS_AUGMENT) &&
         (lVar6 = 0x40, (schema->nodetype & 0x81bd) != LYS_UNKNOWN)) {
        ly_set_add(set,schema,1);
      }
      schema = *(lys_node **)(schema->padding + lVar6 + -0x1c);
    } while (schema != (lys_node *)0x0);
    uVar2 = set->number;
    if (uVar2 == 0) goto LAB_00162338;
    if (node != (lyd_node *)0x0) {
      do {
        if (node->schema == (set->set).s[set->number - 1]) {
          ly_set_add(local_38,node,1);
        }
        node = node->next;
      } while (node != (lyd_node *)0x0);
      uVar2 = set->number;
    }
    while( true ) {
      if ((uVar2 - 1 == 0) || (uVar5 = local_38->number, uVar5 == 0)) {
        free((set->set).s);
        free(set);
        return local_38;
      }
      set_00 = (ly_set *)calloc(1,0x10);
      if (set_00 == (ly_set *)0x0) break;
      uVar7 = 0;
      do {
        node_00 = (local_38->set).s[uVar7]->module;
        if (node_00 != (lys_module *)0x0) {
          do {
            if (node_00->ctx == (ly_ctx *)(set->set).s[uVar2 - 2]) {
              ly_set_add(set_00,node_00,1);
            }
            node_00 = (lys_module *)node_00->dsc;
          } while (node_00 != (lys_module *)0x0);
          uVar5 = local_38->number;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar5);
      free((local_38->set).s);
      free(local_38);
      local_38 = set_00;
      uVar2 = uVar2 - 1;
    }
  }
  pLVar4 = ly_errno_location();
  *pLVar4 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_find_instance");
LAB_00162338:
  ly_set_free(local_38);
  ly_set_free(set);
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lyd_find_instance(const struct lyd_node *data, const struct lys_node *schema)
{
    struct ly_set *ret, *ret_aux, *spath;
    const struct lys_node *siter;
    struct lyd_node *iter;
    unsigned int i, j;

    if (!data || !schema ||
            !(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    ret = ly_set_new();
    spath = ly_set_new();
    if (!ret || !spath) {
        LOGMEM;
        goto error;
    }

    /* find data root */
    while (data->parent) {
        /* vertical move (up) */
        data = data->parent;
    }
    while (data->prev->next) {
        /* horizontal move (left) */
        data = data->prev;
    }

    /* build schema path */
    for (siter = schema; siter; ) {
        if (siter->nodetype == LYS_AUGMENT) {
            siter = ((struct lys_node_augment *)siter)->target;
            continue;
        } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_RPC)) {
            /* standard data node */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);

        } /* else skip the rest node types */
        siter = siter->parent;
    }
    if (!spath->number) {
        /* no valid path */
        goto error;
    }

    /* start searching */
    LY_TREE_FOR((struct lyd_node *)data, iter) {
        if (iter->schema == spath->set.s[spath->number - 1]) {
            ly_set_add(ret, iter, LY_SET_OPT_USEASLIST);
        }
    }
    for (i = spath->number - 1; i; i--) {
        if (!ret->number) {
            /* nothing found */
            break;
        }

        ret_aux = ly_set_new();
        if (!ret_aux) {
            LOGMEM;
            goto error;
        }
        for (j = 0; j < ret->number; j++) {
            LY_TREE_FOR(ret->set.d[j]->child, iter) {
                if (iter->schema == spath->set.s[i - 1]) {
                    ly_set_add(ret_aux, iter, LY_SET_OPT_USEASLIST);
                }
            }
        }
        ly_set_free(ret);
        ret = ret_aux;
    }

    ly_set_free(spath);
    return ret;

error:
    ly_set_free(ret);
    ly_set_free(spath);

    return NULL;
}